

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_b(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  ulong uVar2;
  TCGContext_conflict10 *pTVar3;
  ulong a2;
  target_ulong dest;
  
  ctx->exception = 0x201;
  uVar1 = ctx->opcode;
  dest = (long)((ulong)(uVar1 & 0x3fffffc) << 0x26) >> 0x26;
  if ((uVar1 & 2) == 0) {
    dest = (dest + (ctx->base).pc_next) - 4;
  }
  if ((uVar1 & 1) != 0) {
    uVar2 = (ctx->base).pc_next;
    pTVar3 = ctx->uc->tcg_ctx;
    a2 = uVar2 & 0xffffffff;
    if (ctx->sf_mode != false) {
      a2 = uVar2;
    }
    tcg_gen_op2_ppc64(pTVar3,INDEX_op_movi_i64,(TCGArg)(cpu_lr + (long)pTVar3),a2);
  }
  if (ctx->has_cfar == true) {
    pTVar3 = ctx->uc->tcg_ctx;
    tcg_gen_op2_ppc64(pTVar3,INDEX_op_movi_i64,(TCGArg)(cpu_cfar + (long)pTVar3),
                      (ctx->base).pc_next - 4);
  }
  gen_goto_tb(ctx,0,dest);
  return;
}

Assistant:

static void gen_b(DisasContext *ctx)
{
    target_ulong li, target;

    ctx->exception = POWERPC_EXCP_BRANCH;
    /* sign extend LI */
    li = LI(ctx->opcode);
    li = (li ^ 0x02000000) - 0x02000000;
    if (likely(AA(ctx->opcode) == 0)) {
        target = ctx->base.pc_next + li - 4;
    } else {
        target = li;
    }
    if (LK(ctx->opcode)) {
        gen_setlr(ctx, ctx->base.pc_next);
    }
    gen_update_cfar(ctx, ctx->base.pc_next - 4);
    gen_goto_tb(ctx, 0, target);
}